

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O3

vector<signed_char,_std::allocator<signed_char>_> * __thiscall
jsoncons::decode_traits<std::vector<signed_char,std::allocator<signed_char>>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          decode_traits<std::vector<signed_char,std::allocator<signed_char>>,char,void> *this,
          basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *param_2,error_code *ec)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  typed_array_visitor<std::vector<signed_char,_std::allocator<signed_char>_>_> visitor;
  undefined **local_48;
  vector<signed_char,_std::allocator<signed_char>_> *local_40;
  undefined4 local_38;
  
  (**(code **)(*(long *)this + 0x10))(this,param_2);
  if (*(int *)&(param_2->super_basic_json_visitor<char>)._vptr_basic_json_visitor == 0) {
    pcVar1 = (char *)(**(code **)(*(long *)this + 0x20))(this);
    if (*pcVar1 == '\x0e') {
      (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar2 = (**(code **)(*(long *)this + 0x20))(this);
      if (*(long *)(lVar2 + 0x18) != 0) {
        lVar2 = (**(code **)(*(long *)this + 0x20))(this);
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  (__return_storage_ptr__,*(size_type *)(lVar2 + 0x18));
      }
      local_48 = &PTR__basic_json_visitor_00b33d00;
      local_38 = 0;
      local_40 = __return_storage_ptr__;
      (**(code **)(*(long *)this + 0x30))(this,&local_48,param_2);
      return __return_storage_ptr__;
    }
    if (*pcVar1 == '\x02') {
      pcVar1 = (char *)(**(code **)(*(long *)this + 0x20))(this);
      if (*pcVar1 == '\x02') {
        lVar2 = *(long *)(pcVar1 + 0x10);
        lVar4 = *(long *)(pcVar1 + 0x18);
      }
      else {
        std::error_code::operator=((error_code *)param_2,not_byte_string_view);
        lVar2 = 0;
        lVar4 = 0;
      }
      if (*(int *)&(param_2->super_basic_json_visitor<char>)._vptr_basic_json_visitor == 0) {
        (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar3 = (**(code **)(*(long *)this + 0x20))(this);
        if (*(long *)(lVar3 + 0x18) != 0) {
          lVar3 = (**(code **)(*(long *)this + 0x20))(this);
          std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                    (__return_storage_ptr__,*(size_type *)(lVar3 + 0x18));
        }
        if (lVar4 != 0) {
          lVar3 = 0;
          do {
            local_48 = (undefined **)CONCAT71(local_48._1_7_,*(undefined1 *)(lVar2 + lVar3));
            std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                      (__return_storage_ptr__,(char *)&local_48);
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
        }
        (**(code **)(*(long *)this + 0x40))(this,param_2);
        return __return_storage_ptr__;
      }
    }
    else {
      std::error_code::operator=((error_code *)param_2,not_vector);
    }
  }
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>&, 
            std::error_code& ec)
        {
            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return T{};
            }
            switch (cursor.current().event_type())
            {
                case staj_event_type::byte_string_value:
                {
                    auto bytes = cursor.current().template get<byte_string_view>(ec);
                    if (!ec) 
                    {
                        T v;
                        if (cursor.current().size() > 0)
                        {
                            reserve_storage(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(), v, cursor.current().size());
                        }
                        for (auto ch : bytes)
                        {
                            v.push_back(static_cast<value_type>(ch));
                        }
                        cursor.next(ec);
                        return v;
                    }
                    else
                    {
                        return T{};
                    }
                }
                case staj_event_type::begin_array:
                {
                    T v;
                    if (cursor.current().size() > 0)
                    {
                        reserve_storage(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(), v, cursor.current().size());
                    }
                    typed_array_visitor<T> visitor(v);
                    cursor.read_to(visitor, ec);
                    return v;
                }
                default:
                {
                    ec = conv_errc::not_vector;
                    return T{};
                }
            }
        }